

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  int *piVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  U32 UVar6;
  uint uVar7;
  size_t sVar8;
  BYTE *iStart;
  BYTE *pBVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  U32 UVar13;
  int *piVar14;
  BYTE *pBVar15;
  int *ip;
  size_t offsetFound;
  U32 local_9c;
  size_t local_68;
  int *local_60;
  BYTE *local_58;
  U32 *local_50;
  ulong local_48;
  BYTE *local_40;
  ZSTD_matchState_t *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  local_9c = *rep;
  pZVar4 = ms->dictMatchState;
  pBVar5 = (pZVar4->window).nextSrc;
  local_40 = (pZVar4->window).base;
  local_58 = local_40 + (pZVar4->window).dictLimit;
  local_48 = (ulong)(((int)local_40 - (int)pBVar5) + uVar2);
  UVar13 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  ip = (int *)((ulong)(((int)src - (int)iStart) + (int)pBVar5 == (int)local_58) + (long)src);
  pBVar15 = local_40 + -local_48;
  local_50 = rep;
  local_38 = ms;
LAB_00131ed0:
  do {
    if (piVar1 <= ip) {
      *local_50 = local_9c;
      local_50[1] = UVar13;
      return (long)iEnd - (long)src;
    }
    uVar7 = (((int)ip - (int)pBVar3) - local_9c) + 1;
    if (uVar7 - uVar2 < 0xfffffffd) {
      piVar14 = (int *)(pBVar3 + uVar7);
      if (uVar7 < uVar2) {
        piVar14 = (int *)(local_40 + (uVar7 - (int)local_48));
      }
      if (*piVar14 != *(int *)((long)ip + 1)) goto LAB_00131f15;
      local_60 = (int *)((long)ip + 1);
      pBVar9 = iEnd;
      if (uVar7 < uVar2) {
        pBVar9 = pBVar5;
      }
      sVar8 = ZSTD_count_2segments((BYTE *)((long)ip + 5),(BYTE *)(piVar14 + 1),iEnd,pBVar9,iStart);
      sVar8 = sVar8 + 4;
      sVar10 = 0;
      ip = local_60;
LAB_00131fff:
      ZSTD_storeSeq(seqStore,(long)ip - (long)src,src,(U32)sVar10,sVar8 - 3);
      UVar6 = UVar13;
      for (ip = (int *)((long)ip + sVar8); UVar13 = UVar6, src = ip, ip <= piVar1;
          ip = (int *)((long)ip + sVar8 + 4)) {
        uVar7 = ((int)ip - (int)pBVar3) - UVar13;
        pBVar9 = pBVar3;
        if (uVar7 < uVar2) {
          pBVar9 = pBVar15;
        }
        if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar9 + uVar7) != *ip)) break;
        pBVar12 = iEnd;
        if (uVar7 < uVar2) {
          pBVar12 = pBVar5;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar9 + uVar7) + 4),iEnd,pBVar12,iStart
                          );
        ZSTD_storeSeq(seqStore,0,ip,0,sVar8 + 1);
        UVar6 = local_9c;
        local_9c = UVar13;
      }
      goto LAB_00131ed0;
    }
LAB_00131f15:
    local_68 = 999999999;
    sVar8 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(local_38,(BYTE *)ip,iEnd,&local_68);
    if (3 < sVar8) {
      if (local_68 == 0) {
        sVar10 = 0;
      }
      else {
        uVar11 = (long)ip + (-(long)pBVar3 - local_68) + -0xfffffffe;
        pBVar12 = pBVar3;
        pBVar9 = iStart;
        if ((uint)uVar11 < uVar2) {
          pBVar12 = pBVar15;
          pBVar9 = local_58;
        }
        pBVar12 = pBVar12 + (uVar11 & 0xffffffff);
        for (; ((src < ip && (pBVar9 < pBVar12)) && (*(BYTE *)((long)ip + -1) == pBVar12[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar12 = pBVar12 + -1;
          sVar8 = sVar8 + 1;
        }
        sVar10 = local_68;
        UVar13 = local_9c;
        local_9c = (int)local_68 - 2;
      }
      goto LAB_00131fff;
    }
    ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 0, ZSTD_dictMatchState);
}